

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
         *this,LinearSpace3fa *space,size_t i)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  uint uVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  BufferView<embree::Vec3fa> *pBVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  float fVar44;
  float fVar47;
  float fVar48;
  undefined1 auVar45 [16];
  float fVar49;
  undefined1 auVar46 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined4 uVar54;
  undefined1 auVar57 [12];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  float fVar62;
  float fVar63;
  undefined1 auVar59 [16];
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  vfloat4 b0;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar75;
  float fVar76;
  vfloat4 a0_2;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  vfloat4 a0_3;
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [32];
  vfloat4 b0_1;
  undefined1 auVar90 [16];
  float fVar91;
  float fVar93;
  float fVar94;
  float fVar95;
  undefined1 auVar92 [16];
  float fVar96;
  float fVar98;
  float fVar99;
  undefined1 auVar97 [16];
  float fVar100;
  vfloat4 a0_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  vfloat4 a0;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           vertices.items;
  uVar3 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.field_0x68);
  uVar9 = (ulong)uVar3;
  pcVar5 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  lVar12 = sVar6 * uVar9;
  uVar10 = (ulong)(uVar3 + 1);
  lVar11 = sVar6 * uVar10;
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  pcVar7 = (pBVar4->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar4->super_RawBufferView).stride;
  lVar14 = sVar6 * uVar9;
  lVar13 = sVar6 * uVar10;
  fVar70 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar18 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar12),
                          ZEXT416((uint)(fVar70 * *(float *)(pcVar5 + lVar12 + 0xc))),0x30);
  auVar17 = vinsertps_avx(*(undefined1 (*) [16])(pcVar5 + lVar11),
                          ZEXT416((uint)(fVar70 * *(float *)(pcVar5 + lVar11 + 0xc))),0x30);
  auVar20 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + lVar14),
                          ZEXT416((uint)(fVar70 * *(float *)(pcVar7 + lVar14 + 0xc))),0x30);
  auVar15 = vinsertps_avx(*(undefined1 (*) [16])(pcVar7 + lVar13),
                          ZEXT416((uint)(fVar70 * *(float *)(pcVar7 + lVar13 + 0xc))),0x30);
  auVar65._8_4_ = 0xbeaaaaab;
  auVar65._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar65._12_4_ = 0xbeaaaaab;
  auVar21 = vfnmadd213ps_fma(auVar20,auVar65,auVar18);
  auVar71 = vfmadd213ps_fma(auVar15,auVar65,auVar17);
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           normals.items;
  pcVar5 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar8->super_RawBufferView).stride;
  auVar20 = *(undefined1 (*) [16])(pcVar5 + sVar6 * uVar9);
  auVar15 = *(undefined1 (*) [16])(pcVar5 + sVar6 * uVar10);
  pBVar8 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           dnormals.items;
  pcVar5 = (pBVar8->super_RawBufferView).ptr_ofs;
  sVar6 = (pBVar8->super_RawBufferView).stride;
  auVar19 = vfnmadd132ps_fma(*(undefined1 (*) [16])(pcVar5 + uVar9 * sVar6),auVar20,auVar65);
  auVar52 = vfmadd132ps_fma(auVar65,auVar15,*(undefined1 (*) [16])(pcVar5 + sVar6 * uVar10));
  auVar51 = ZEXT816(0) << 0x20;
  auVar45._0_4_ = auVar17._0_4_ * 0.0;
  auVar45._4_4_ = auVar17._4_4_ * 0.0;
  auVar45._8_4_ = auVar17._8_4_ * 0.0;
  auVar45._12_4_ = auVar17._12_4_ * 0.0;
  auVar16 = vfmadd231ps_fma(auVar45,auVar71,auVar51);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar21,auVar16);
  auVar50._0_4_ = auVar18._0_4_ + auVar45._0_4_;
  auVar50._4_4_ = auVar18._4_4_ + auVar45._4_4_;
  auVar50._8_4_ = auVar18._8_4_ + auVar45._8_4_;
  auVar50._12_4_ = auVar18._12_4_ + auVar45._12_4_;
  auVar97._8_4_ = 0x40400000;
  auVar97._0_8_ = 0x4040000040400000;
  auVar97._12_4_ = 0x40400000;
  auVar45 = vfmadd231ps_fma(auVar16,auVar21,auVar97);
  auVar46 = vfnmadd231ps_fma(auVar45,auVar18,auVar97);
  auVar101._0_4_ = auVar15._0_4_ * 0.0;
  auVar101._4_4_ = auVar15._4_4_ * 0.0;
  auVar101._8_4_ = auVar15._8_4_ * 0.0;
  auVar101._12_4_ = auVar15._12_4_ * 0.0;
  auVar16 = vfmadd231ps_fma(auVar101,auVar52,auVar51);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar19,auVar16);
  auVar103._0_4_ = auVar20._0_4_ + auVar45._0_4_;
  auVar103._4_4_ = auVar20._4_4_ + auVar45._4_4_;
  auVar103._8_4_ = auVar20._8_4_ + auVar45._8_4_;
  auVar103._12_4_ = auVar20._12_4_ + auVar45._12_4_;
  auVar45 = vfmadd231ps_fma(auVar16,auVar19,auVar97);
  auVar16 = vfnmadd231ps_fma(auVar45,auVar20,auVar97);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar71,auVar17);
  auVar45 = vfmadd231ps_fma(auVar45,auVar21,auVar51);
  auVar45 = vfmadd231ps_fma(auVar45,auVar18,auVar51);
  auVar59._0_4_ = auVar17._0_4_ * 3.0;
  auVar59._4_4_ = auVar17._4_4_ * 3.0;
  auVar59._8_4_ = auVar17._8_4_ * 3.0;
  auVar59._12_4_ = auVar17._12_4_ * 3.0;
  auVar17 = vfnmadd231ps_fma(auVar59,auVar97,auVar71);
  auVar17 = vfmadd231ps_fma(auVar17,auVar51,auVar21);
  auVar21 = vfnmadd231ps_fma(auVar17,auVar51,auVar18);
  auVar18 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar52,auVar15);
  auVar18 = vfmadd231ps_fma(auVar18,auVar19,auVar51);
  auVar71 = vfmadd231ps_fma(auVar18,auVar20,auVar51);
  auVar81._0_4_ = auVar15._0_4_ * 3.0;
  auVar81._4_4_ = auVar15._4_4_ * 3.0;
  auVar81._8_4_ = auVar15._8_4_ * 3.0;
  auVar81._12_4_ = auVar15._12_4_ * 3.0;
  auVar15 = vfnmadd231ps_fma(auVar81,auVar97,auVar52);
  auVar15 = vfmadd231ps_fma(auVar15,auVar51,auVar19);
  auVar19 = vfnmadd231ps_fma(auVar15,auVar51,auVar20);
  auVar20 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar15 = vshufps_avx(auVar103,auVar103,0xc9);
  fVar44 = auVar46._0_4_;
  auVar78._0_4_ = fVar44 * auVar15._0_4_;
  fVar47 = auVar46._4_4_;
  auVar78._4_4_ = fVar47 * auVar15._4_4_;
  fVar48 = auVar46._8_4_;
  auVar78._8_4_ = fVar48 * auVar15._8_4_;
  fVar49 = auVar46._12_4_;
  auVar78._12_4_ = fVar49 * auVar15._12_4_;
  auVar15 = vfmsub231ps_fma(auVar78,auVar20,auVar103);
  auVar18 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar16,auVar16,0xc9);
  auVar85._0_4_ = auVar15._0_4_ * fVar44;
  auVar85._4_4_ = auVar15._4_4_ * fVar47;
  auVar85._8_4_ = auVar15._8_4_ * fVar48;
  auVar85._12_4_ = auVar15._12_4_ * fVar49;
  auVar20 = vfmsub231ps_fma(auVar85,auVar20,auVar16);
  auVar17 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar20 = vshufps_avx(auVar21,auVar21,0xc9);
  auVar15 = vshufps_avx(auVar71,auVar71,0xc9);
  fVar58 = auVar21._0_4_;
  auVar66._0_4_ = fVar58 * auVar15._0_4_;
  fVar62 = auVar21._4_4_;
  auVar66._4_4_ = fVar62 * auVar15._4_4_;
  fVar63 = auVar21._8_4_;
  auVar66._8_4_ = fVar63 * auVar15._8_4_;
  fVar64 = auVar21._12_4_;
  auVar66._12_4_ = fVar64 * auVar15._12_4_;
  auVar15 = vfmsub231ps_fma(auVar66,auVar20,auVar71);
  auVar52 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar15 = vshufps_avx(auVar19,auVar19,0xc9);
  auVar71._0_4_ = fVar58 * auVar15._0_4_;
  auVar71._4_4_ = fVar62 * auVar15._4_4_;
  auVar71._8_4_ = fVar63 * auVar15._8_4_;
  auVar71._12_4_ = fVar64 * auVar15._12_4_;
  auVar20 = vfmsub231ps_fma(auVar71,auVar20,auVar19);
  auVar71 = vshufps_avx(auVar20,auVar20,0xc9);
  auVar20 = vdpps_avx(auVar18,auVar18,0x7f);
  auVar57 = SUB1612(ZEXT816(0),0);
  auVar90._4_12_ = auVar57;
  auVar90._0_4_ = auVar20._0_4_;
  auVar15 = vrsqrt14ss_avx512f(auVar51,auVar90);
  fVar70 = auVar15._0_4_;
  fVar76 = fVar70 * 1.5 - auVar20._0_4_ * 0.5 * fVar70 * fVar70 * fVar70;
  fVar96 = fVar76 * auVar18._0_4_;
  fVar98 = fVar76 * auVar18._4_4_;
  fVar99 = fVar76 * auVar18._8_4_;
  fVar100 = fVar76 * auVar18._12_4_;
  auVar15 = vdpps_avx(auVar18,auVar17,0x7f);
  auVar16 = vbroadcastss_avx512vl(auVar20);
  auVar17 = vmulps_avx512vl(auVar16,auVar17);
  fVar70 = auVar15._0_4_;
  auVar79._0_4_ = fVar70 * auVar18._0_4_;
  auVar79._4_4_ = fVar70 * auVar18._4_4_;
  auVar79._8_4_ = fVar70 * auVar18._8_4_;
  auVar79._12_4_ = fVar70 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar17,auVar79);
  auVar15 = vrcp14ss_avx512f(auVar51,auVar90);
  auVar20 = vfnmadd213ss_fma(auVar20,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar70 = auVar15._0_4_ * auVar20._0_4_;
  auVar20 = vdpps_avx(auVar52,auVar52,0x7f);
  fVar75 = auVar20._0_4_;
  auVar82._4_12_ = auVar57;
  auVar82._0_4_ = fVar75;
  auVar15 = vrsqrt14ss_avx512f(auVar51,auVar82);
  fVar77 = auVar15._0_4_;
  fVar77 = fVar77 * 1.5 - fVar75 * 0.5 * fVar77 * fVar77 * fVar77;
  fVar91 = fVar77 * auVar52._0_4_;
  fVar93 = fVar77 * auVar52._4_4_;
  fVar94 = fVar77 * auVar52._8_4_;
  fVar95 = fVar77 * auVar52._12_4_;
  auVar15 = vdpps_avx(auVar52,auVar71,0x7f);
  auVar72._0_4_ = fVar75 * auVar71._0_4_;
  auVar72._4_4_ = fVar75 * auVar71._4_4_;
  auVar72._8_4_ = fVar75 * auVar71._8_4_;
  auVar72._12_4_ = fVar75 * auVar71._12_4_;
  fVar75 = auVar15._0_4_;
  auVar17._0_4_ = fVar75 * auVar52._0_4_;
  auVar17._4_4_ = fVar75 * auVar52._4_4_;
  auVar17._8_4_ = fVar75 * auVar52._8_4_;
  auVar17._12_4_ = fVar75 * auVar52._12_4_;
  auVar17 = vsubps_avx(auVar72,auVar17);
  auVar15 = vrcp14ss_avx512f(auVar51,auVar82);
  auVar20 = vfnmadd213ss_fma(auVar20,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar75 = auVar20._0_4_ * auVar15._0_4_;
  auVar20 = vshufps_avx(auVar50,auVar50,0xff);
  auVar73._0_4_ = fVar96 * auVar20._0_4_;
  auVar73._4_4_ = fVar98 * auVar20._4_4_;
  auVar73._8_4_ = fVar99 * auVar20._8_4_;
  auVar73._12_4_ = fVar100 * auVar20._12_4_;
  auVar52 = vsubps_avx(auVar50,auVar73);
  auVar15 = vshufps_avx(auVar46,auVar46,0xff);
  auVar67._0_4_ = auVar15._0_4_ * fVar96 + auVar20._0_4_ * fVar76 * fVar70 * auVar18._0_4_;
  auVar67._4_4_ = auVar15._4_4_ * fVar98 + auVar20._4_4_ * fVar76 * fVar70 * auVar18._4_4_;
  auVar67._8_4_ = auVar15._8_4_ * fVar99 + auVar20._8_4_ * fVar76 * fVar70 * auVar18._8_4_;
  auVar67._12_4_ = auVar15._12_4_ * fVar100 + auVar20._12_4_ * fVar76 * fVar70 * auVar18._12_4_;
  auVar18 = vsubps_avx(auVar46,auVar67);
  auVar86._0_4_ = auVar50._0_4_ + auVar73._0_4_;
  auVar86._4_4_ = auVar50._4_4_ + auVar73._4_4_;
  auVar86._8_4_ = auVar50._8_4_ + auVar73._8_4_;
  auVar86._12_4_ = auVar50._12_4_ + auVar73._12_4_;
  auVar20 = vshufps_avx(auVar45,auVar45,0xff);
  auVar68._0_4_ = fVar91 * auVar20._0_4_;
  auVar68._4_4_ = fVar93 * auVar20._4_4_;
  auVar68._8_4_ = fVar94 * auVar20._8_4_;
  auVar68._12_4_ = fVar95 * auVar20._12_4_;
  auVar71 = vsubps_avx(auVar45,auVar68);
  auVar15 = vshufps_avx(auVar21,auVar21,0xff);
  auVar55._0_4_ = fVar91 * auVar15._0_4_ + auVar20._0_4_ * fVar77 * auVar17._0_4_ * fVar75;
  auVar55._4_4_ = fVar93 * auVar15._4_4_ + auVar20._4_4_ * fVar77 * auVar17._4_4_ * fVar75;
  auVar55._8_4_ = fVar94 * auVar15._8_4_ + auVar20._8_4_ * fVar77 * auVar17._8_4_ * fVar75;
  auVar55._12_4_ = fVar95 * auVar15._12_4_ + auVar20._12_4_ * fVar77 * auVar17._12_4_ * fVar75;
  auVar20 = vsubps_avx(auVar21,auVar55);
  auVar51._0_4_ = auVar45._0_4_ + auVar68._0_4_;
  auVar51._4_4_ = auVar45._4_4_ + auVar68._4_4_;
  auVar51._8_4_ = auVar45._8_4_ + auVar68._8_4_;
  auVar51._12_4_ = auVar45._12_4_ + auVar68._12_4_;
  fVar70 = auVar52._0_4_;
  auVar60._0_4_ = fVar70 + auVar18._0_4_ * 0.33333334;
  auVar60._4_4_ = auVar52._4_4_ + auVar18._4_4_ * 0.33333334;
  auVar60._8_4_ = auVar52._8_4_ + auVar18._8_4_ * 0.33333334;
  auVar60._12_4_ = auVar52._12_4_ + auVar18._12_4_ * 0.33333334;
  auVar69._0_4_ = auVar20._0_4_ * 0.33333334;
  auVar69._4_4_ = auVar20._4_4_ * 0.33333334;
  auVar69._8_4_ = auVar20._8_4_ * 0.33333334;
  auVar69._12_4_ = auVar20._12_4_ * 0.33333334;
  auVar17 = vsubps_avx(auVar71,auVar69);
  auVar92._0_4_ = auVar86._0_4_ + (fVar44 + auVar67._0_4_) * 0.33333334;
  auVar92._4_4_ = auVar86._4_4_ + (fVar47 + auVar67._4_4_) * 0.33333334;
  auVar92._8_4_ = auVar86._8_4_ + (fVar48 + auVar67._8_4_) * 0.33333334;
  auVar92._12_4_ = auVar86._12_4_ + (fVar49 + auVar67._12_4_) * 0.33333334;
  auVar20._0_4_ = (fVar58 + auVar55._0_4_) * 0.33333334;
  auVar20._4_4_ = (fVar62 + auVar55._4_4_) * 0.33333334;
  auVar20._8_4_ = (fVar63 + auVar55._8_4_) * 0.33333334;
  auVar20._12_4_ = (fVar64 + auVar55._12_4_) * 0.33333334;
  auVar45 = vsubps_avx(auVar51,auVar20);
  auVar16._4_4_ = fVar70;
  auVar16._0_4_ = fVar70;
  auVar16._8_4_ = fVar70;
  auVar16._12_4_ = fVar70;
  auVar15 = vshufps_avx(auVar52,auVar52,0x55);
  aVar1 = (space->vx).field_0;
  aVar2 = (space->vy).field_0;
  auVar20 = *(undefined1 (*) [16])(space->vz).field_0.m128;
  auVar18 = vshufps_avx(auVar52,auVar52,0xaa);
  fVar70 = auVar20._0_4_;
  auVar56._0_4_ = fVar70 * auVar18._0_4_;
  fVar75 = auVar20._4_4_;
  auVar56._4_4_ = fVar75 * auVar18._4_4_;
  fVar76 = auVar20._8_4_;
  auVar56._8_4_ = fVar76 * auVar18._8_4_;
  fVar77 = auVar20._12_4_;
  auVar56._12_4_ = fVar77 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar56,(undefined1  [16])aVar2,auVar15);
  auVar52 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar1,auVar16);
  auVar19._4_4_ = auVar60._0_4_;
  auVar19._0_4_ = auVar60._0_4_;
  auVar19._8_4_ = auVar60._0_4_;
  auVar19._12_4_ = auVar60._0_4_;
  auVar15 = vshufps_avx(auVar60,auVar60,0x55);
  auVar18 = vshufps_avx(auVar60,auVar60,0xaa);
  auVar83._0_4_ = fVar70 * auVar18._0_4_;
  auVar83._4_4_ = fVar75 * auVar18._4_4_;
  auVar83._8_4_ = fVar76 * auVar18._8_4_;
  auVar83._12_4_ = fVar77 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar2,auVar15);
  auVar16 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar1,auVar19);
  uVar54 = auVar17._0_4_;
  auVar21._4_4_ = uVar54;
  auVar21._0_4_ = uVar54;
  auVar21._8_4_ = uVar54;
  auVar21._12_4_ = uVar54;
  auVar15 = vshufps_avx(auVar17,auVar17,0x55);
  auVar18 = vshufps_avx(auVar17,auVar17,0xaa);
  auVar102._0_4_ = fVar70 * auVar18._0_4_;
  auVar102._4_4_ = fVar75 * auVar18._4_4_;
  auVar102._8_4_ = fVar76 * auVar18._8_4_;
  auVar102._12_4_ = fVar77 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar102,(undefined1  [16])aVar2,auVar15);
  auVar17 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar1,auVar21);
  uVar54 = auVar71._0_4_;
  auVar46._4_4_ = uVar54;
  auVar46._0_4_ = uVar54;
  auVar46._8_4_ = uVar54;
  auVar46._12_4_ = uVar54;
  auVar15 = vshufps_avx(auVar71,auVar71,0x55);
  auVar18 = vshufps_avx(auVar71,auVar71,0xaa);
  auVar104._0_4_ = fVar70 * auVar18._0_4_;
  auVar104._4_4_ = fVar75 * auVar18._4_4_;
  auVar104._8_4_ = fVar76 * auVar18._8_4_;
  auVar104._12_4_ = fVar77 * auVar18._12_4_;
  auVar15 = vfmadd231ps_fma(auVar104,(undefined1  [16])aVar2,auVar15);
  auVar71 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar1,auVar46);
  auVar53._4_4_ = auVar86._0_4_;
  auVar53._0_4_ = auVar86._0_4_;
  auVar53._8_4_ = auVar86._0_4_;
  auVar53._12_4_ = auVar86._0_4_;
  auVar15 = vshufps_avx(auVar86,auVar86,0x55);
  auVar18 = vshufps_avx(auVar86,auVar86,0xaa);
  auVar18 = vmulps_avx512vl(auVar20,auVar18);
  auVar15 = vfmadd231ps_avx512vl(auVar18,(undefined1  [16])aVar2,auVar15);
  auVar19 = vfmadd231ps_avx512vl(auVar15,(undefined1  [16])aVar1,auVar53);
  auVar61._4_4_ = auVar92._0_4_;
  auVar61._0_4_ = auVar92._0_4_;
  auVar61._8_4_ = auVar92._0_4_;
  auVar61._12_4_ = auVar92._0_4_;
  auVar15 = vshufps_avx(auVar92,auVar92,0x55);
  auVar18 = vshufps_avx(auVar92,auVar92,0xaa);
  auVar20 = vmulps_avx512vl(auVar20,auVar18);
  auVar20 = vfmadd231ps_avx512vl(auVar20,(undefined1  [16])aVar2,auVar15);
  auVar21 = vfmadd231ps_avx512vl(auVar20,(undefined1  [16])aVar1,auVar61);
  uVar54 = auVar45._0_4_;
  auVar87._4_4_ = uVar54;
  auVar87._0_4_ = uVar54;
  auVar87._8_4_ = uVar54;
  auVar87._12_4_ = uVar54;
  auVar20 = vshufps_avx(auVar45,auVar45,0x55);
  auVar15 = vshufps_avx(auVar45,auVar45,0xaa);
  auVar18._0_4_ = fVar70 * auVar15._0_4_;
  auVar18._4_4_ = fVar75 * auVar15._4_4_;
  auVar18._8_4_ = fVar76 * auVar15._8_4_;
  auVar18._12_4_ = fVar77 * auVar15._12_4_;
  auVar20 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar2,auVar20);
  auVar18 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar1,auVar87);
  auVar88._4_4_ = auVar51._0_4_;
  auVar88._0_4_ = auVar51._0_4_;
  auVar88._8_4_ = auVar51._0_4_;
  auVar88._12_4_ = auVar51._0_4_;
  auVar20 = vshufps_avx(auVar51,auVar51,0x55);
  auVar15 = vshufps_avx(auVar51,auVar51,0xaa);
  auVar74._0_4_ = fVar70 * auVar15._0_4_;
  auVar74._4_4_ = fVar75 * auVar15._4_4_;
  auVar74._8_4_ = fVar76 * auVar15._8_4_;
  auVar74._12_4_ = fVar77 * auVar15._12_4_;
  auVar20 = vfmadd231ps_fma(auVar74,(undefined1  [16])aVar2,auVar20);
  auVar20 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar1,auVar88);
  auVar22 = vbroadcastss_avx512vl(ZEXT416(1));
  uVar54 = auVar52._0_4_;
  auVar38._4_4_ = uVar54;
  auVar38._0_4_ = uVar54;
  auVar38._8_4_ = uVar54;
  auVar38._12_4_ = uVar54;
  auVar38._16_4_ = uVar54;
  auVar38._20_4_ = uVar54;
  auVar38._24_4_ = uVar54;
  auVar38._28_4_ = uVar54;
  auVar23 = vpermps_avx512vl(auVar22,ZEXT1632(auVar52));
  auVar24 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar25 = vpermps_avx512vl(auVar24,ZEXT1632(auVar52));
  auVar26 = vbroadcastss_avx512vl(auVar16);
  auVar27 = vpermps_avx512vl(auVar22,ZEXT1632(auVar16));
  auVar28 = vpermps_avx512vl(auVar24,ZEXT1632(auVar16));
  auVar29 = vbroadcastss_avx512vl(auVar17);
  auVar30 = vpermps_avx512vl(auVar22,ZEXT1632(auVar17));
  auVar31 = vpermps_avx512vl(auVar24,ZEXT1632(auVar17));
  auVar32 = vbroadcastss_avx512vl(auVar71);
  auVar33 = vpermps_avx512vl(auVar22,ZEXT1632(auVar71));
  auVar34 = vpermps_avx512vl(auVar24,ZEXT1632(auVar71));
  auVar35 = vmulps_avx512vl(auVar32,bezier_basis0._3944_32_);
  auVar36 = vmulps_avx512vl(auVar33,bezier_basis0._3944_32_);
  auVar37 = vmulps_avx512vl(auVar34,bezier_basis0._3944_32_);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._2788_32_,auVar29);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._2788_32_,auVar30);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._2788_32_,auVar31);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._1632_32_,auVar26);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._1632_32_,auVar27);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._1632_32_,auVar28);
  auVar35 = vfmadd231ps_avx512vl(auVar35,bezier_basis0._476_32_,auVar38);
  auVar36 = vfmadd231ps_avx512vl(auVar36,bezier_basis0._476_32_,auVar23);
  auVar37 = vfmadd231ps_avx512vl(auVar37,bezier_basis0._476_32_,auVar25);
  auVar32 = vmulps_avx512vl(auVar32,bezier_basis0._8568_32_);
  auVar33 = vmulps_avx512vl(auVar33,bezier_basis0._8568_32_);
  auVar34 = vmulps_avx512vl(auVar34,bezier_basis0._8568_32_);
  auVar29 = vfmadd231ps_avx512vl(auVar32,bezier_basis0._7412_32_,auVar29);
  auVar30 = vfmadd231ps_avx512vl(auVar33,bezier_basis0._7412_32_,auVar30);
  auVar31 = vfmadd231ps_avx512vl(auVar34,bezier_basis0._7412_32_,auVar31);
  auVar26 = vfmadd231ps_avx512vl(auVar29,bezier_basis0._6256_32_,auVar26);
  auVar27 = vfmadd231ps_avx512vl(auVar30,bezier_basis0._6256_32_,auVar27);
  auVar28 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._6256_32_,auVar28);
  auVar26 = vfmadd231ps_avx512vl(auVar26,bezier_basis0._5100_32_,auVar38);
  auVar23 = vfmadd231ps_avx512vl(auVar27,bezier_basis0._5100_32_,auVar23);
  auVar25 = vfmadd231ps_avx512vl(auVar28,bezier_basis0._5100_32_,auVar25);
  auVar30._8_4_ = 0x3d638e39;
  auVar30._0_8_ = 0x3d638e393d638e39;
  auVar30._12_4_ = 0x3d638e39;
  auVar30._16_4_ = 0x3d638e39;
  auVar30._20_4_ = 0x3d638e39;
  auVar30._24_4_ = 0x3d638e39;
  auVar30._28_4_ = 0x3d638e39;
  auVar28 = vmulps_avx512vl(auVar26,auVar30);
  auVar29 = vmulps_avx512vl(auVar23,auVar30);
  auVar30 = vmulps_avx512vl(auVar25,auVar30);
  auVar23 = vblendps_avx(auVar28,ZEXT832(0) << 0x20,1);
  auVar25 = vblendps_avx(auVar29,ZEXT832(0) << 0x20,1);
  auVar33 = ZEXT832(0) << 0x20;
  auVar26 = vblendps_avx(auVar30,auVar33,1);
  auVar27 = vsubps_avx(auVar35,auVar23);
  auVar31 = vsubps_avx512vl(auVar36,auVar25);
  auVar32 = vsubps_avx512vl(auVar37,auVar26);
  auVar23 = vblendps_avx(auVar28,auVar33,0x80);
  auVar25 = vblendps_avx(auVar29,auVar33,0x80);
  auVar26 = vblendps_avx(auVar30,auVar33,0x80);
  auVar40._0_4_ = auVar35._0_4_ + auVar23._0_4_;
  auVar40._4_4_ = auVar35._4_4_ + auVar23._4_4_;
  auVar40._8_4_ = auVar35._8_4_ + auVar23._8_4_;
  auVar40._12_4_ = auVar35._12_4_ + auVar23._12_4_;
  auVar40._16_4_ = auVar35._16_4_ + auVar23._16_4_;
  auVar40._20_4_ = auVar35._20_4_ + auVar23._20_4_;
  auVar40._24_4_ = auVar35._24_4_ + auVar23._24_4_;
  auVar40._28_4_ = auVar35._28_4_ + auVar23._28_4_;
  auVar29 = vaddps_avx512vl(auVar36,auVar25);
  auVar26 = vaddps_avx512vl(auVar37,auVar26);
  auVar80._8_4_ = 0x7f800000;
  auVar80._0_8_ = 0x7f8000007f800000;
  auVar80._12_4_ = 0x7f800000;
  auVar80._16_4_ = 0x7f800000;
  auVar80._20_4_ = 0x7f800000;
  auVar80._24_4_ = 0x7f800000;
  auVar80._28_4_ = 0x7f800000;
  auVar23 = vminps_avx(auVar80,auVar35);
  auVar30 = vminps_avx512vl(auVar80,auVar36);
  auVar33 = vminps_avx512vl(auVar80,auVar37);
  auVar25 = vminps_avx(auVar27,auVar40);
  auVar28 = vminps_avx(auVar23,auVar25);
  auVar23 = vminps_avx512vl(auVar31,auVar29);
  auVar34 = vminps_avx512vl(auVar30,auVar23);
  auVar23 = vminps_avx512vl(auVar32,auVar26);
  auVar33 = vminps_avx512vl(auVar33,auVar23);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
  auVar25 = vmaxps_avx512vl(auVar38,auVar35);
  auVar30 = vmaxps_avx512vl(auVar38,auVar36);
  auVar35 = vmaxps_avx512vl(auVar38,auVar37);
  auVar23 = vmaxps_avx(auVar27,auVar40);
  auVar36 = vmaxps_avx512vl(auVar25,auVar23);
  auVar23 = vmaxps_avx512vl(auVar31,auVar29);
  auVar37 = vmaxps_avx512vl(auVar30,auVar23);
  auVar23 = vmaxps_avx512vl(auVar32,auVar26);
  auVar32 = vmaxps_avx512vl(auVar35,auVar23);
  auVar23 = vbroadcastss_avx512vl(auVar19);
  auVar25 = vpermps_avx512vl(auVar22,ZEXT1632(auVar19));
  auVar26 = vpermps_avx512vl(auVar24,ZEXT1632(auVar19));
  auVar27 = vbroadcastss_avx512vl(auVar21);
  auVar29 = vpermps_avx512vl(auVar22,ZEXT1632(auVar21));
  auVar30 = vpermps_avx512vl(auVar24,ZEXT1632(auVar21));
  auVar31 = vbroadcastss_avx512vl(auVar18);
  auVar35 = vpermps_avx512vl(auVar22,ZEXT1632(auVar18));
  auVar39 = vpermps_avx512vl(auVar24,ZEXT1632(auVar18));
  uVar54 = auVar20._0_4_;
  auVar43._4_4_ = uVar54;
  auVar43._0_4_ = uVar54;
  auVar43._8_4_ = uVar54;
  auVar43._12_4_ = uVar54;
  auVar43._16_4_ = uVar54;
  auVar43._20_4_ = uVar54;
  auVar43._24_4_ = uVar54;
  auVar43._28_4_ = uVar54;
  auVar22 = vpermps_avx512vl(auVar22,ZEXT1632(auVar20));
  auVar24 = vpermps_avx512vl(auVar24,ZEXT1632(auVar20));
  auVar40 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
  auVar41 = vmulps_avx512vl(auVar22,bezier_basis0._3944_32_);
  auVar42 = vmulps_avx512vl(auVar24,bezier_basis0._3944_32_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._2788_32_,auVar31);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._2788_32_,auVar35);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar39,bezier_basis0._2788_32_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._1632_32_,auVar27);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._1632_32_,auVar29);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar30,bezier_basis0._1632_32_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,bezier_basis0._476_32_,auVar23);
  auVar41 = vfmadd231ps_avx512vl(auVar41,bezier_basis0._476_32_,auVar25);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar26,bezier_basis0._476_32_);
  auVar43 = vmulps_avx512vl(auVar43,bezier_basis0._8568_32_);
  auVar22 = vmulps_avx512vl(auVar22,bezier_basis0._8568_32_);
  auVar24 = vmulps_avx512vl(auVar24,bezier_basis0._8568_32_);
  auVar31 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar31);
  auVar22 = vfmadd231ps_avx512vl(auVar22,bezier_basis0._7412_32_,auVar35);
  auVar24 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._7412_32_,auVar39);
  auVar27 = vfmadd231ps_avx512vl(auVar31,bezier_basis0._6256_32_,auVar27);
  auVar22 = vfmadd231ps_avx512vl(auVar22,bezier_basis0._6256_32_,auVar29);
  auVar24 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._6256_32_,auVar30);
  auVar20 = vfmadd231ps_fma(auVar27,bezier_basis0._5100_32_,auVar23);
  auVar15 = vfmadd231ps_fma(auVar22,bezier_basis0._5100_32_,auVar25);
  auVar23 = vfmadd231ps_avx512vl(auVar24,bezier_basis0._5100_32_,auVar26);
  auVar24 = ZEXT1632(CONCAT412(auVar20._12_4_ * 0.055555556,
                               CONCAT48(auVar20._8_4_ * 0.055555556,
                                        CONCAT44(auVar20._4_4_ * 0.055555556,
                                                 auVar20._0_4_ * 0.055555556))));
  auVar27._28_4_ = bezier_basis0._5128_4_;
  auVar27._0_28_ =
       ZEXT1628(CONCAT412(auVar15._12_4_ * 0.055555556,
                          CONCAT48(auVar15._8_4_ * 0.055555556,
                                   CONCAT44(auVar15._4_4_ * 0.055555556,auVar15._0_4_ * 0.055555556)
                                  )));
  auVar22._4_4_ = auVar23._4_4_ * 0.055555556;
  auVar22._0_4_ = auVar23._0_4_ * 0.055555556;
  auVar22._8_4_ = auVar23._8_4_ * 0.055555556;
  auVar22._12_4_ = auVar23._12_4_ * 0.055555556;
  auVar22._16_4_ = auVar23._16_4_ * 0.055555556;
  auVar22._20_4_ = auVar23._20_4_ * 0.055555556;
  auVar22._24_4_ = auVar23._24_4_ * 0.055555556;
  auVar22._28_4_ = 0x3d638e39;
  auVar35 = ZEXT832(0) << 0x20;
  auVar23 = vblendps_avx(auVar24,auVar35,1);
  auVar25 = vblendps_avx(auVar27,auVar35,1);
  auVar26 = vblendps_avx(auVar22,auVar35,1);
  auVar29 = vsubps_avx(auVar40,auVar23);
  auVar30 = vsubps_avx(auVar41,auVar25);
  auVar31 = vsubps_avx(auVar42,auVar26);
  auVar23 = vblendps_avx(auVar24,auVar35,0x80);
  auVar25 = vblendps_avx(auVar27,auVar35,0x80);
  auVar26 = vblendps_avx(auVar22,auVar35,0x80);
  auVar39._0_4_ = auVar40._0_4_ + auVar23._0_4_;
  auVar39._4_4_ = auVar40._4_4_ + auVar23._4_4_;
  auVar39._8_4_ = auVar40._8_4_ + auVar23._8_4_;
  auVar39._12_4_ = auVar40._12_4_ + auVar23._12_4_;
  auVar39._16_4_ = auVar40._16_4_ + auVar23._16_4_;
  auVar39._20_4_ = auVar40._20_4_ + auVar23._20_4_;
  auVar39._24_4_ = auVar40._24_4_ + auVar23._24_4_;
  auVar39._28_4_ = auVar40._28_4_ + auVar23._28_4_;
  auVar84._0_4_ = auVar25._0_4_ + auVar41._0_4_;
  auVar84._4_4_ = auVar25._4_4_ + auVar41._4_4_;
  auVar84._8_4_ = auVar25._8_4_ + auVar41._8_4_;
  auVar84._12_4_ = auVar25._12_4_ + auVar41._12_4_;
  auVar84._16_4_ = auVar25._16_4_ + auVar41._16_4_;
  auVar84._20_4_ = auVar25._20_4_ + auVar41._20_4_;
  auVar84._24_4_ = auVar25._24_4_ + auVar41._24_4_;
  auVar84._28_4_ = auVar25._28_4_ + auVar41._28_4_;
  auVar89._0_4_ = auVar42._0_4_ + auVar26._0_4_;
  auVar89._4_4_ = auVar42._4_4_ + auVar26._4_4_;
  auVar89._8_4_ = auVar42._8_4_ + auVar26._8_4_;
  auVar89._12_4_ = auVar42._12_4_ + auVar26._12_4_;
  auVar89._16_4_ = auVar42._16_4_ + auVar26._16_4_;
  auVar89._20_4_ = auVar42._20_4_ + auVar26._20_4_;
  auVar89._24_4_ = auVar42._24_4_ + auVar26._24_4_;
  auVar89._28_4_ = auVar42._28_4_ + auVar26._28_4_;
  auVar23 = vminps_avx(auVar80,auVar40);
  auVar25 = vminps_avx(auVar80,auVar41);
  auVar26 = vminps_avx(auVar80,auVar42);
  auVar27 = vminps_avx(auVar29,auVar39);
  auVar35 = vminps_avx512vl(auVar23,auVar27);
  auVar23 = vminps_avx(auVar30,auVar84);
  auVar22 = vminps_avx(auVar25,auVar23);
  auVar23 = vminps_avx(auVar31,auVar89);
  auVar24 = vminps_avx(auVar26,auVar23);
  auVar25 = vmaxps_avx512vl(auVar38,auVar40);
  auVar26 = vmaxps_avx512vl(auVar38,auVar41);
  auVar27 = vmaxps_avx512vl(auVar38,auVar42);
  auVar23 = vmaxps_avx(auVar29,auVar39);
  auVar23 = vmaxps_avx(auVar25,auVar23);
  auVar25 = vmaxps_avx(auVar30,auVar84);
  auVar25 = vmaxps_avx(auVar26,auVar25);
  auVar26 = vmaxps_avx(auVar31,auVar89);
  auVar26 = vmaxps_avx(auVar27,auVar26);
  auVar27 = vshufps_avx512vl(auVar36,auVar36,0xb1);
  auVar29 = vmaxps_avx512vl(auVar36,auVar27);
  auVar27 = vshufpd_avx(auVar29,auVar29,5);
  auVar27 = vmaxps_avx(auVar29,auVar27);
  auVar20 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx512vl(auVar37,auVar37,0xb1);
  auVar29 = vmaxps_avx512vl(auVar37,auVar27);
  auVar27 = vshufpd_avx(auVar29,auVar29,5);
  auVar27 = vmaxps_avx(auVar29,auVar27);
  auVar15 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar15 = vunpcklps_avx(auVar20,auVar15);
  auVar27 = vshufps_avx(auVar32,auVar32,0xb1);
  auVar27 = vmaxps_avx(auVar32,auVar27);
  auVar29 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vmaxps_avx(auVar27,auVar29);
  auVar20 = vmaxps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar20 = vinsertps_avx(auVar15,auVar20,0x28);
  auVar27 = vshufps_avx(auVar28,auVar28,0xb1);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar28 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar28);
  auVar15 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar27 = vminps_avx(auVar34,auVar27);
  auVar28 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar28);
  auVar18 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar18 = vunpcklps_avx(auVar15,auVar18);
  auVar27 = vshufps_avx512vl(auVar33,auVar33,0xb1);
  auVar28 = vminps_avx512vl(auVar33,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar15 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar15 = vinsertps_avx(auVar18,auVar15,0x28);
  auVar27 = vshufps_avx512vl(auVar35,auVar35,0xb1);
  auVar28 = vminps_avx512vl(auVar35,auVar27);
  auVar27 = vshufpd_avx(auVar28,auVar28,5);
  auVar27 = vminps_avx(auVar28,auVar27);
  auVar18 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar27 = vshufps_avx(auVar22,auVar22,0xb1);
  auVar27 = vminps_avx(auVar22,auVar27);
  auVar28 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar28);
  auVar17 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar17 = vunpcklps_avx(auVar18,auVar17);
  auVar27 = vshufps_avx(auVar24,auVar24,0xb1);
  auVar27 = vminps_avx(auVar24,auVar27);
  auVar28 = vshufpd_avx(auVar27,auVar27,5);
  auVar27 = vminps_avx(auVar27,auVar28);
  auVar18 = vminps_avx(auVar27._0_16_,auVar27._16_16_);
  auVar18 = vinsertps_avx(auVar17,auVar18,0x28);
  auVar17 = vminps_avx(auVar15,auVar18);
  auVar27 = vshufps_avx(auVar23,auVar23,0xb1);
  auVar23 = vmaxps_avx(auVar23,auVar27);
  auVar27 = vshufpd_avx(auVar23,auVar23,5);
  auVar23 = vmaxps_avx(auVar23,auVar27);
  auVar15 = vmaxps_avx(auVar23._0_16_,auVar23._16_16_);
  auVar23 = vshufps_avx(auVar25,auVar25,0xb1);
  auVar23 = vmaxps_avx(auVar25,auVar23);
  auVar25 = vshufpd_avx(auVar23,auVar23,5);
  auVar23 = vmaxps_avx(auVar23,auVar25);
  auVar18 = vmaxps_avx(auVar23._0_16_,auVar23._16_16_);
  auVar18 = vunpcklps_avx(auVar15,auVar18);
  auVar23 = vshufps_avx(auVar26,auVar26,0xb1);
  auVar23 = vmaxps_avx(auVar26,auVar23);
  auVar25 = vshufpd_avx(auVar23,auVar23,5);
  auVar23 = vmaxps_avx(auVar23,auVar25);
  auVar15 = vmaxps_avx(auVar23._0_16_,auVar23._16_16_);
  auVar15 = vinsertps_avx(auVar18,auVar15,0x28);
  auVar18 = vmaxps_avx(auVar20,auVar15);
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar20 = vandps_avx(auVar17,auVar15);
  auVar15 = vandps_avx(auVar18,auVar15);
  auVar20 = vmaxps_avx(auVar20,auVar15);
  auVar15 = vmovshdup_avx(auVar20);
  auVar15 = vmaxss_avx(auVar15,auVar20);
  auVar20 = vshufpd_avx(auVar20,auVar20,1);
  auVar20 = vmaxss_avx(auVar20,auVar15);
  fVar70 = auVar20._0_4_ * 4.7683716e-07;
  auVar52._4_4_ = fVar70;
  auVar52._0_4_ = fVar70;
  auVar52._8_4_ = fVar70;
  auVar52._12_4_ = fVar70;
  aVar1 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar17,auVar52);
  (__return_storage_ptr__->lower).field_0 = aVar1;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar18._0_4_ + fVar70;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar18._4_4_ + fVar70;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar18._8_4_ + fVar70;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar18._12_4_ + fVar70;
  return __return_storage_ptr__;
}

Assistant:

size_t CurveGeometry::getGeometryDataDeviceByteSize() const {
    size_t byte_size = sizeof(CurveGeometry);
    if (vertices.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (normals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    if (tangents.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3ff>);
    if (dnormals.size() > 0)
      byte_size += numTimeSteps * sizeof(BufferView<Vec3fa>);
    return 16 * ((byte_size + 15) / 16);
  }